

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O3

Gia_Man_t *
Abc_NtkFinMiterToGia
          (Abc_Ntk_t *pNtk,Vec_Int_t *vTypes,Vec_Int_t *vCos,Vec_Int_t *vCis,Vec_Int_t *vNodes,
          int *iObjs,int *Types,Vec_Int_t *vLits)

{
  int iVar1;
  char *pcVar2;
  Abc_Obj_t *pAVar3;
  ulong uVar4;
  Gia_Obj_t *pGVar5;
  void *pvVar6;
  bool bVar7;
  int iVar8;
  Vec_Int_t *vTemp;
  int *piVar9;
  Gia_Man_t *p;
  size_t sVar10;
  char *pcVar11;
  Gia_Obj_t *pGVar12;
  ulong uVar13;
  Gia_Man_t *pGVar14;
  int Type;
  int iVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  bool bVar21;
  ulong uVar22;
  
  vTemp = (Vec_Int_t *)malloc(0x10);
  vTemp->nCap = 100;
  vTemp->nSize = 0;
  piVar9 = (int *)malloc(400);
  vTemp->pArray = piVar9;
  p = Gia_ManStart(1000);
  pcVar2 = pNtk->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar11 = (char *)0x0;
  }
  else {
    sVar10 = strlen(pcVar2);
    pcVar11 = (char *)malloc(sVar10 + 1);
    strcpy(pcVar11,pcVar2);
  }
  p->pName = pcVar11;
  pcVar2 = pNtk->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar11 = (char *)0x0;
  }
  else {
    sVar10 = strlen(pcVar2);
    pcVar11 = (char *)malloc(sVar10 + 1);
    strcpy(pcVar11,pcVar2);
  }
  p->pSpec = pcVar11;
  Gia_ManHashStart(p);
  iVar15 = vCis->nSize;
  if (0 < iVar15) {
    lVar18 = 0;
    do {
      iVar8 = vCis->pArray[lVar18];
      if (((long)iVar8 < 0) || (pNtk->vObjs->nSize <= iVar8)) goto LAB_002b4989;
      pAVar3 = (Abc_Obj_t *)pNtk->vObjs->pArray[iVar8];
      if (pAVar3 != (Abc_Obj_t *)0x0) {
        pGVar12 = Gia_ManAppendObj(p);
        uVar4 = *(ulong *)pGVar12;
        *(ulong *)pGVar12 = uVar4 | 0x9fffffff;
        *(ulong *)pGVar12 =
             uVar4 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar5 = p->pObjs;
        if ((pGVar12 < pGVar5) || (pGVar5 + p->nObjs <= pGVar12)) goto LAB_002b49a8;
        Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar12 - (long)pGVar5) >> 2) * -0x55555555);
        pGVar5 = p->pObjs;
        if ((pGVar12 < pGVar5) || (pGVar5 + p->nObjs <= pGVar12)) goto LAB_002b49a8;
        iVar15 = (int)((ulong)((long)pGVar12 - (long)pGVar5) >> 2) * 0x55555556;
        lVar20 = 0;
        bVar7 = true;
        do {
          bVar21 = bVar7;
          iVar8 = iObjs[lVar20];
          iVar1 = pAVar3->Id;
          iVar19 = (int)lVar20;
          if (iVar8 == iVar1) {
            if (Types[lVar20] == -0x61) {
              if (iVar8 < 0) goto LAB_002b492c;
              if (iVar15 < 0) goto LAB_002b496a;
              uVar16 = iVar19 + iVar8 * 2;
              iVar8 = iVar15 + 1;
            }
            else {
              if (iVar8 < 0) goto LAB_002b492c;
              uVar16 = iVar19 + iVar8 * 2;
              iVar8 = Abc_NtkFinSimOneLit(p,pAVar3,Types[lVar20],vLits,iVar19,vTemp);
            }
          }
          else {
            if (iVar1 < 0) goto LAB_002b492c;
            uVar16 = iVar19 + iVar1 * 2;
            iVar8 = iVar15;
          }
          if (vLits->nSize <= (int)uVar16) goto LAB_002b494b;
          vLits->pArray[uVar16] = iVar8;
          lVar20 = 1;
          bVar7 = false;
        } while (bVar21);
        iVar15 = vCis->nSize;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < iVar15);
  }
  iVar15 = vNodes->nSize;
  if (0 < iVar15) {
    lVar18 = 0;
    do {
      iVar8 = vNodes->pArray[lVar18];
      if (((long)iVar8 < 0) || (pNtk->vObjs->nSize <= iVar8)) goto LAB_002b4989;
      pAVar3 = (Abc_Obj_t *)pNtk->vObjs->pArray[iVar8];
      if (pAVar3 != (Abc_Obj_t *)0x0) {
        if ((pNtk->ntkFunc == ABC_FUNC_MAP) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
          iVar15 = Mio_GateReadCell((Mio_Gate_t *)(pAVar3->field_5).pData);
        }
        else {
          iVar15 = pAVar3->Id;
          if (((long)iVar15 < 0) || (vTypes->nSize <= iVar15)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar15 = vTypes->pArray[iVar15];
        }
        lVar20 = 0;
        bVar7 = true;
        do {
          bVar21 = bVar7;
          iVar1 = iObjs[lVar20];
          iVar8 = pAVar3->Id;
          iVar19 = (int)lVar20;
          if (iVar1 == iVar8) {
            Type = Types[lVar20];
            if (Type != -0x61) {
              if (-1 < iVar1) goto LAB_002b46a4;
              goto LAB_002b492c;
            }
            if (iVar1 < 0) goto LAB_002b492c;
            uVar16 = Abc_NtkFinSimOneLit(p,pAVar3,iVar15,vLits,iVar19,vTemp);
            if ((int)uVar16 < 0) {
LAB_002b496a:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x131,"int Abc_LitNot(int)");
            }
            uVar17 = iVar19 + iVar1 * 2;
            if (vLits->nSize <= (int)uVar17) {
LAB_002b494b:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            uVar16 = uVar16 ^ 1;
          }
          else {
            Type = iVar15;
            iVar1 = iVar8;
            if (iVar8 < 0) goto LAB_002b492c;
LAB_002b46a4:
            uVar17 = iVar19 + iVar1 * 2;
            uVar16 = Abc_NtkFinSimOneLit(p,pAVar3,Type,vLits,iVar19,vTemp);
            if (vLits->nSize <= (int)uVar17) goto LAB_002b494b;
          }
          vLits->pArray[uVar17] = uVar16;
          lVar20 = 1;
          bVar7 = false;
        } while (bVar21);
        iVar15 = vNodes->nSize;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < iVar15);
  }
  iVar15 = vCos->nSize;
  if (iVar15 < 1) {
    uVar16 = 0;
  }
  else {
    lVar18 = 0;
    uVar16 = 0;
    do {
      iVar8 = vCos->pArray[lVar18];
      if (((long)iVar8 < 0) || (pNtk->vObjs->nSize <= iVar8)) {
LAB_002b4989:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar6 = pNtk->vObjs->pArray[iVar8];
      if (pvVar6 != (void *)0x0) {
        uVar17 = **(uint **)((long)pvVar6 + 0x20);
        if ((int)uVar17 < 0) {
LAB_002b492c:
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        if (vLits->nSize <= (int)(uVar17 * 2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        iVar15 = Gia_ManHashXor(p,vLits->pArray[(ulong)uVar17 * 2],
                                vLits->pArray[(ulong)uVar17 * 2 + 1]);
        uVar16 = Gia_ManHashOr(p,uVar16,iVar15);
        iVar15 = vCos->nSize;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < iVar15);
    if ((int)uVar16 < 0) goto LAB_002b4a05;
  }
  uVar17 = uVar16 >> 1;
  if ((int)uVar17 < p->nObjs) {
    if ((~*(uint *)(p->pObjs + uVar17) & 0x1fffffff) != 0 && (int)*(uint *)(p->pObjs + uVar17) < 0)
    {
      __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x316,"int Gia_ManAppendCo(Gia_Man_t *, int)");
    }
    pGVar12 = Gia_ManAppendObj(p);
    uVar4 = *(ulong *)pGVar12;
    *(ulong *)pGVar12 = uVar4 | 0x80000000;
    pGVar5 = p->pObjs;
    if ((pGVar5 <= pGVar12) && (pGVar12 < pGVar5 + p->nObjs)) {
      uVar13 = (ulong)(((uint)((int)pGVar12 - (int)pGVar5) >> 2) * -0x55555555 - uVar17 & 0x1fffffff
                      );
      uVar22 = (ulong)((uVar16 & 1) << 0x1d);
      *(ulong *)pGVar12 = uVar22 | uVar4 & 0xffffffffc0000000 | 0x80000000 | uVar13;
      *(ulong *)pGVar12 =
           uVar22 | uVar4 & 0xe0000000c0000000 | 0x80000000 | uVar13 |
           (ulong)(p->vCos->nSize & 0x1fffffff) << 0x20;
      pGVar5 = p->pObjs;
      if ((pGVar5 <= pGVar12) && (pGVar12 < pGVar5 + p->nObjs)) {
        Vec_IntPush(p->vCos,(int)((ulong)((long)pGVar12 - (long)pGVar5) >> 2) * -0x55555555);
        if (p->pFanData != (int *)0x0) {
          Gia_ObjAddFanout(p,pGVar12 + -(ulong)((uint)*(undefined8 *)pGVar12 & 0x1fffffff),pGVar12);
        }
        if ((p->pObjs <= pGVar12) && (pGVar12 < p->pObjs + p->nObjs)) {
          pGVar14 = Gia_ManCleanup(p);
          Gia_ManStop(p);
          if (vTemp->pArray != (int *)0x0) {
            free(vTemp->pArray);
          }
          free(vTemp);
          return pGVar14;
        }
      }
    }
LAB_002b49a8:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
LAB_002b4a05:
  __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
}

Assistant:

Gia_Man_t * Abc_NtkFinMiterToGia( Abc_Ntk_t * pNtk, Vec_Int_t * vTypes, Vec_Int_t * vCos, Vec_Int_t * vCis, Vec_Int_t * vNodes, 
                                  int iObjs[2], int Types[2], Vec_Int_t * vLits )
{
    Gia_Man_t * pNew = NULL, * pTemp;
    Abc_Obj_t * pObj; 
    Vec_Int_t * vTemp = Vec_IntAlloc( 100 );
    int n, i, Type, iMiter, iLit, * pLits;
    // create AIG manager
    pNew = Gia_ManStart( 1000 );
    pNew->pName = Abc_UtilStrsav( pNtk->pName );
    pNew->pSpec = Abc_UtilStrsav( pNtk->pSpec );
    Gia_ManHashStart( pNew );
    // create inputs
    Abc_NtkForEachObjVec( vCis, pNtk, pObj, i )
    {
        iLit = Gia_ManAppendCi(pNew);
        for ( n = 0; n < 2; n++ )
        {
            if ( iObjs[n] != (int)Abc_ObjId(pObj) )
                Vec_IntWriteEntry( vLits, Abc_Var2Lit(Abc_ObjId(pObj), n), iLit );
            else if ( Types[n] != ABC_FIN_NEG )
                Vec_IntWriteEntry( vLits, Abc_Var2Lit(Abc_ObjId(pObj), n), Abc_NtkFinSimOneLit(pNew, pObj, Types[n], vLits, n, vTemp) );
            else // if ( iObjs[n] == (int)Abc_ObjId(pObj) && Types[n] == ABC_FIN_NEG )
                Vec_IntWriteEntry( vLits, Abc_Var2Lit(Abc_ObjId(pObj), n), Abc_LitNot(iLit) );
        }
    }
    // create internal nodes
    Abc_NtkForEachObjVec( vNodes, pNtk, pObj, i )
    {
        Type = Abc_NtkIsMappedLogic(pNtk) ? Mio_GateReadCell((Mio_Gate_t *)pObj->pData) : Vec_IntEntry(vTypes, Abc_ObjId(pObj));
        for ( n = 0; n < 2; n++ )
        {
            if ( iObjs[n] != (int)Abc_ObjId(pObj) )
                Vec_IntWriteEntry( vLits, Abc_Var2Lit(Abc_ObjId(pObj), n), Abc_NtkFinSimOneLit(pNew, pObj, Type, vLits, n, vTemp) );
            else if ( Types[n] != ABC_FIN_NEG )
                Vec_IntWriteEntry( vLits, Abc_Var2Lit(Abc_ObjId(pObj), n), Abc_NtkFinSimOneLit(pNew, pObj, Types[n], vLits, n, vTemp) );
            else // if ( iObjs[n] == (int)Abc_ObjId(pObj) && Types[n] == ABC_FIN_NEG )
                Vec_IntWriteEntry( vLits, Abc_Var2Lit(Abc_ObjId(pObj), n), Abc_LitNot(Abc_NtkFinSimOneLit(pNew, pObj, Type, vLits, n, vTemp)) );
        }
    }
    // create comparator
    iMiter = 0;
    Abc_NtkForEachObjVec( vCos, pNtk, pObj, i )
    {
        pLits  = Vec_IntEntryP( vLits, Abc_Var2Lit(Abc_ObjFaninId0(pObj), 0) );
        iLit   = Gia_ManHashXor( pNew, pLits[0], pLits[1] );
        iMiter = Gia_ManHashOr( pNew, iMiter, iLit );
    }
    Gia_ManAppendCo( pNew, iMiter );
    // perform cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    Vec_IntFree( vTemp );
    return pNew;
}